

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O2

ChannelUri * aeron::archive::ChannelUri::parse(ChannelUri *__return_storage_ptr__,string *str)

{
  char cVar1;
  undefined8 uVar2;
  ChannelUri *this;
  bool bVar3;
  mapped_type *pmVar4;
  IllegalArgumentException *pIVar5;
  char *pcVar6;
  ulong uVar7;
  int __val;
  char cVar8;
  long lVar9;
  allocator local_172;
  allocator local_171;
  ChannelUri *local_170;
  string buffer;
  string media;
  string key;
  string local_108;
  string local_e8;
  string local_c8;
  ParamsMap params;
  string prefix;
  string local_50;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  bVar3 = anon_unknown.dwarf_5f34a::startsWith
                    (str,0,(string *)(anonymous_namespace)::SPY_PREFIX_abi_cxx11_);
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&prefix);
    lVar9 = (anonymous_namespace)::SPY_PREFIX_abi_cxx11_._8_8_;
  }
  else {
    lVar9 = 0;
  }
  bVar3 = anon_unknown.dwarf_5f34a::startsWith
                    (str,(int32_t)lVar9,(string *)(anonymous_namespace)::AERON_PREFIX_abi_cxx11_);
  uVar2 = (anonymous_namespace)::AERON_PREFIX_abi_cxx11_._8_8_;
  if (!bVar3) {
    pIVar5 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
    std::operator+(&media,"Aeron URIs must start with \'aeron:\', found: \'",str);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                   &media,"\'");
    std::__cxx11::string::string
              ((string *)&key,
               "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",
               (allocator *)&local_e8);
    pcVar6 = aeron::util::past_prefix
                       ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                       );
    std::__cxx11::string::string((string *)&buffer,pcVar6,(allocator *)&local_108);
    aeron::util::IllegalArgumentException::IllegalArgumentException
              (pIVar5,(string *)&params,&key,&buffer,0x76);
    __cxa_throw(pIVar5,&aeron::util::IllegalArgumentException::typeinfo,
                aeron::util::SourcedException::~SourcedException);
  }
  media._M_dataplus._M_p = (pointer)&media.field_2;
  media._M_string_length = 0;
  __val = 0;
  media.field_2._M_local_buf[0] = '\0';
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  buffer.field_2._M_local_buf[0] = '\0';
  local_170 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)&buffer);
  uVar7 = uVar2 + lVar9;
  params._M_h._M_buckets = &params._M_h._M_single_bucket;
  params._M_h._M_bucket_count = 1;
  params._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  params._M_h._M_element_count = 0;
  params._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  params._M_h._M_rehash_policy._M_next_resize = 0;
  params._M_h._M_single_bucket = (__node_base_ptr)0x0;
  do {
    this = local_170;
    if (str->_M_string_length <= uVar7) {
      if (__val == 0) {
        pmVar4 = &media;
      }
      else {
        if (__val != 2) {
          pIVar5 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_108,__val);
          std::operator+(&local_e8,"no more input found, state=",&local_108);
          std::__cxx11::string::string
                    ((string *)&local_c8,
                     "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",
                     &local_171);
          pcVar6 = aeron::util::past_prefix
                             ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                             );
          std::__cxx11::string::string((string *)&local_50,pcVar6,&local_172);
          aeron::util::IllegalArgumentException::IllegalArgumentException
                    (pIVar5,&local_e8,&local_c8,&local_50,0xc6);
          __cxa_throw(pIVar5,&aeron::util::IllegalArgumentException::typeinfo,
                      aeron::util::SourcedException::~SourcedException);
        }
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&params,&key);
      }
      std::__cxx11::string::_M_assign((string *)pmVar4);
      ChannelUri(this,&prefix,&media,&params);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&params._M_h);
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::string::~string((string *)&key);
      std::__cxx11::string::~string((string *)&media);
      std::__cxx11::string::~string((string *)&prefix);
      return this;
    }
    cVar1 = (str->_M_dataplus)._M_p[uVar7];
    cVar8 = (char)&buffer;
    if (__val == 0) {
      pmVar4 = &media;
      if (cVar1 == '?') {
LAB_00143398:
        std::__cxx11::string::_M_assign((string *)pmVar4);
        __val = 1;
LAB_001433a6:
        buffer._M_string_length = 0;
        *buffer._M_dataplus._M_p = '\0';
      }
      else {
        if (cVar1 == ':') {
          pIVar5 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
          std::__cxx11::string::string
                    ((string *)&local_e8,"encountered \':\' within media definition",
                     (allocator *)&local_50);
          std::__cxx11::string::string
                    ((string *)&local_108,
                     "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",
                     &local_171);
          pcVar6 = aeron::util::past_prefix
                             ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                             );
          std::__cxx11::string::string((string *)&local_c8,pcVar6,&local_172);
          aeron::util::IllegalArgumentException::IllegalArgumentException
                    (pIVar5,&local_e8,&local_108,&local_c8,0x91);
          __cxa_throw(pIVar5,&aeron::util::IllegalArgumentException::typeinfo,
                      aeron::util::SourcedException::~SourcedException);
        }
        __val = 0;
        std::__cxx11::string::push_back(cVar8);
      }
    }
    else if (__val == 1) {
      if (cVar1 == '=') {
        std::__cxx11::string::_M_assign((string *)&key);
        __val = 2;
        goto LAB_001433a6;
      }
      std::__cxx11::string::push_back(cVar8);
      __val = 1;
    }
    else {
      if (cVar1 == '|') {
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&params,&key);
        goto LAB_00143398;
      }
      std::__cxx11::string::push_back(cVar8);
      __val = 2;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

ChannelUri ChannelUri::parse(const std::string& str) {
    std::size_t position = 0;
    std::string prefix;

    if (startsWith(str, SPY_PREFIX)) {
        prefix = SPY_QUALIFIER;
        position += SPY_PREFIX.size();
    }

    if (!startsWith(str, position, AERON_PREFIX)) {
        throw aeron::util::IllegalArgumentException("Aeron URIs must start with 'aeron:', found: '" + str + "'",
                                                    SOURCEINFO);
    } else {
        position += AERON_PREFIX.size();
    }

    std::string media, key;
    State state = State::MEDIA;

    std::string buffer;
    buffer.reserve(str.size());

    ParamsMap params;

    while (position < str.size()) {
        char c = str[position++];

        switch (state) {
            case State::MEDIA:
                switch (c) {
                    case '?':
                        media = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    case ':':
                        throw aeron::util::IllegalArgumentException("encountered ':' within media definition",
                                                                    SOURCEINFO);

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_KEY:
                switch (c) {
                    case '=':
                        key = buffer;
                        buffer.clear();
                        state = State::PARAMS_VALUE;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_VALUE:
                switch (c) {
                    case '|':
                        params[key] = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            default:
                throw aeron::util::IllegalStateException("unexpected state=" + std::to_string(static_cast<int>(state)),
                                                         SOURCEINFO);
        }
    }

    switch (state) {
        case State::MEDIA:
            media = buffer;
            break;

        case State::PARAMS_VALUE:
            params[key] = buffer;
            break;

        default:
            throw aeron::util::IllegalArgumentException(
                "no more input found, state=" + std::to_string(static_cast<int>(state)), SOURCEINFO);
    }

    return ChannelUri(prefix, media, std::move(params));
}